

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O0

uchar * ableton::discovery::v1::toNetworkByteStream<unsigned_char*>
                  (MessageHeader<ableton::link::NodeId> *header,uchar *out)

{
  uint8_t byte;
  uint16_t s;
  uchar *puVar1;
  uchar *out_local;
  MessageHeader<ableton::link::NodeId> *header_local;
  
  s = header->groupId;
  byte = header->ttl;
  puVar1 = discovery::toNetworkByteStream<unsigned_char*>(header->messageType,out);
  puVar1 = discovery::toNetworkByteStream<unsigned_char*>(byte,puVar1);
  puVar1 = discovery::toNetworkByteStream<unsigned_char*>(s,puVar1);
  puVar1 = toNetworkByteStream<unsigned_char,8ul,unsigned_char*>
                     (&(header->ident).super_NodeIdArray,puVar1);
  return puVar1;
}

Assistant:

It toNetworkByteStream(const MessageHeader& header, It out)
  {
    return discovery::toNetworkByteStream(header.ident,
      discovery::toNetworkByteStream(header.groupId,
        discovery::toNetworkByteStream(header.ttl,
          discovery::toNetworkByteStream(header.messageType, std::move(out)))));
  }